

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

MRIStepCoupling MRIStepCoupling_Alloc(int nmat,int stages,MRISTEP_METHOD_TYPE type)

{
  realtype *prVar1;
  realtype ***ppprVar2;
  realtype **pprVar3;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  MRIStepCoupling MRIC;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar4;
  int local_18;
  MRIStepCoupling local_8;
  
  if ((in_EDI < 1) || (in_ESI < 1)) {
    local_8 = (MRIStepCoupling)0x0;
  }
  else {
    local_8 = (MRIStepCoupling)malloc(0x28);
    if (local_8 == (MRIStepCoupling)0x0) {
      local_8 = (MRIStepCoupling)0x0;
    }
    else {
      local_8->nmat = in_EDI;
      local_8->stages = in_ESI;
      local_8->q = 0;
      local_8->p = 0;
      local_8->c = (realtype *)0x0;
      local_8->W = (realtype ***)0x0;
      local_8->G = (realtype ***)0x0;
      prVar1 = (realtype *)calloc((long)in_ESI,8);
      local_8->c = prVar1;
      if (local_8->c == (realtype *)0x0) {
        MRIStepCoupling_Free
                  ((MRIStepCoupling)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        local_8 = (MRIStepCoupling)0x0;
      }
      else {
        if ((in_EDX == 0) || (in_EDX == 2)) {
          ppprVar2 = (realtype ***)calloc((long)in_EDI,8);
          local_8->W = ppprVar2;
          if (local_8->W == (realtype ***)0x0) {
            MRIStepCoupling_Free
                      ((MRIStepCoupling)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
            return (MRIStepCoupling)0x0;
          }
          for (local_18 = 0; local_18 < in_EDI; local_18 = local_18 + 1) {
            local_8->W[local_18] = (realtype **)0x0;
            pprVar3 = (realtype **)calloc((long)in_ESI,8);
            local_8->W[local_18] = pprVar3;
            if (local_8->W[local_18] == (realtype **)0x0) {
              MRIStepCoupling_Free
                        ((MRIStepCoupling)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
              return (MRIStepCoupling)0x0;
            }
          }
          for (local_18 = 0; local_18 < in_EDI; local_18 = local_18 + 1) {
            for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < in_ESI;
                in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
              local_8->W[local_18][in_stack_ffffffffffffffe4] = (realtype *)0x0;
              prVar1 = (realtype *)calloc((long)in_ESI,8);
              local_8->W[local_18][in_stack_ffffffffffffffe4] = prVar1;
              if (local_8->W[local_18][in_stack_ffffffffffffffe4] == (realtype *)0x0) {
                MRIStepCoupling_Free
                          ((MRIStepCoupling)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
                return (MRIStepCoupling)0x0;
              }
            }
          }
        }
        if ((in_EDX == 1) || (in_EDX == 2)) {
          ppprVar2 = (realtype ***)calloc((long)in_EDI,8);
          local_8->G = ppprVar2;
          if (local_8->G == (realtype ***)0x0) {
            MRIStepCoupling_Free
                      ((MRIStepCoupling)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
            local_8 = (MRIStepCoupling)0x0;
          }
          else {
            for (local_18 = 0; local_18 < in_EDI; local_18 = local_18 + 1) {
              local_8->G[local_18] = (realtype **)0x0;
              pprVar3 = (realtype **)calloc((long)in_ESI,8);
              local_8->G[local_18] = pprVar3;
              if (local_8->G[local_18] == (realtype **)0x0) {
                MRIStepCoupling_Free
                          ((MRIStepCoupling)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
                return (MRIStepCoupling)0x0;
              }
            }
            for (local_18 = 0; local_18 < in_EDI; local_18 = local_18 + 1) {
              for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
                local_8->G[local_18][iVar4] = (realtype *)0x0;
                prVar1 = (realtype *)calloc((long)in_ESI,8);
                local_8->G[local_18][iVar4] = prVar1;
                if (local_8->G[local_18][iVar4] == (realtype *)0x0) {
                  MRIStepCoupling_Free((MRIStepCoupling)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
                  return (MRIStepCoupling)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Alloc(int nmat, int stages,
                                      MRISTEP_METHOD_TYPE type)
{
  int i, j;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal input values */
  if (nmat < 1 || stages < 1) return(NULL);

  /* ------------------------------------------
   * Allocate and initialize coupling structure
   * ------------------------------------------ */

  MRIC = (MRIStepCoupling) malloc(sizeof(struct MRIStepCouplingMem));
  if (!MRIC) return(NULL);

  MRIC->nmat   = nmat;
  MRIC->stages = stages;
  MRIC->q      = 0;
  MRIC->p      = 0;
  MRIC->c      = NULL;
  MRIC->W      = NULL;
  MRIC->G      = NULL;

  /* --------------------------------------------
   * Allocate abscissae and coupling coefficients
   * -------------------------------------------- */

  MRIC->c = (realtype *) calloc( stages, sizeof(realtype) );
  if (!(MRIC->c)) { MRIStepCoupling_Free(MRIC); return(NULL); }

  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX) {

    /* allocate W matrices */
    MRIC->W = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->W)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in W */
    for (i=0; i<nmat; i++) {
      MRIC->W[i] = NULL;
      MRIC->W[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->W[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in W */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->W[i][j] = NULL;
        MRIC->W[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->W[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX) {

    /* allocate G matrices */
    MRIC->G = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->G)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in G */
    for (i=0; i<nmat; i++) {
      MRIC->G[i] = NULL;
      MRIC->G[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->G[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in G */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->G[i][j] = NULL;
        MRIC->G[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->G[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  return(MRIC);
}